

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.h
# Opt level: O0

void image_32_filter_75_case(response_layer *layer,integral_image *iimage)

{
  undefined1 auVar1 [16];
  long lVar2;
  int iVar3;
  integral_image *piVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined8 uStack_140;
  float local_138 [4];
  float local_128;
  int local_124;
  long local_120;
  ulong local_118;
  unsigned_long __vla_expr0;
  int local_104;
  int local_100;
  int y;
  int x;
  int t9;
  int t8;
  int t7;
  int t6;
  int t5;
  int t4;
  int t3;
  int t2;
  int t1;
  int t0;
  int j;
  int i;
  int k0;
  int k;
  int ind;
  bool *laplacian;
  float *response;
  int c01;
  int c00;
  int r01;
  int r00;
  int c11;
  int c10;
  int r11;
  int r10;
  float D1;
  float D0;
  float C1;
  float C0;
  float B1;
  float B0;
  float A1;
  float A0;
  float D;
  float C;
  float B;
  float A;
  float Dyy1;
  float Dyy0;
  float Dxy;
  float Dyy;
  float Dxx;
  float inv_area;
  int lobe;
  int border;
  int filter_size;
  int step;
  float *data;
  uint local_28;
  int iheight;
  int iwidth;
  int data_width;
  int width;
  int height;
  integral_image *iimage_local;
  response_layer *layer_local;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  __vla_expr0 = (unsigned_long)local_138;
  data_width = layer->height;
  iwidth = layer->width;
  iheight = iimage->data_width;
  local_28 = iimage->width;
  data._4_4_ = iimage->height;
  _filter_size = iimage->data;
  border = layer->step;
  lobe = layer->filter_size;
  inv_area = (float)((lobe + -1) - (lobe + -1 >> 0x1f) >> 1);
  Dxx = (float)(lobe / 3);
  Dyy = 1.0 / (float)(lobe * lobe);
  laplacian = (bool *)layer->response;
  _k = layer->laplacian;
  k0 = 0;
  local_118 = (ulong)local_28;
  lVar2 = -(local_118 * 4 + 0xf & 0xfffffffffffffff0);
  local_120 = (long)local_138 + lVar2;
  for (t0 = 0; t0 < iwidth * border - (int)Dxx; t0 = border + t0) {
    *(float *)(local_120 + (long)t0 * 4) =
         _filter_size[(data._4_4_ + -1) * iheight + t0 + (int)Dxx + -1];
  }
  A1 = _filter_size[(int)((data._4_4_ + -1) * iheight + (local_28 - 1))];
  for (; t0 < (int)Dxx; t0 = border + t0) {
    *(float *)(local_120 + (long)t0 * 4) = A1;
  }
  for (; t0 < iwidth * border; t0 = border + t0) {
    A0 = _filter_size[(data._4_4_ + -1) * iheight + (t0 - (int)Dxx)];
    *(float *)(local_120 + (long)t0 * 4) = A1 - A0;
  }
  _width = iimage;
  iimage_local = (integral_image *)layer;
  for (local_100 = 0; local_100 < data_width * border; local_100 = border + local_100) {
    t2 = local_100 - (int)Dxx;
    t3 = local_100 + (int)Dxx + -1;
    t4 = (int)Dxx / 2 + 1;
    t5 = local_100 + -1;
    t7 = (local_100 - (int)Dxx) + -1;
    t9 = local_100 + (int)Dxx;
    local_124 = local_100;
    y = (local_100 - (int)Dxx / 2) + -1;
    for (local_104 = 0; piVar4 = _width, iVar3 = y, local_104 < iwidth * border;
        local_104 = border + local_104) {
      t6 = local_104 + -1;
      iVar5 = local_104 - (int)Dxx;
      t8 = iVar5 + -1;
      x = local_104 + (int)Dxx;
      local_138[0] = *(float *)(local_120 + (long)local_104 * 4);
      iVar6 = y + (int)Dxx;
      iVar7 = x + -2;
      *(undefined8 *)((long)&uStack_140 + lVar2) = 0x18631e;
      auVar9._0_4_ = box_integral_unconditional_opt(piVar4,iVar3,iVar5,iVar6,iVar7);
      piVar4 = _width;
      iVar5 = t2;
      iVar3 = t3;
      auVar9._4_60_ = extraout_var;
      auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar9._0_16_,
                               ZEXT416((uint)local_138[0]));
      Dyy0 = auVar1._0_4_;
      iVar6 = local_104 - (int)inv_area;
      iVar7 = local_104 + (int)inv_area;
      *(undefined8 *)((long)&uStack_140 + lVar2) = 0x186368;
      local_138[1] = box_integral_unconditional_opt(piVar4,iVar5,iVar6 + -1,iVar3,iVar7);
      piVar4 = _width;
      iVar5 = t2;
      iVar3 = t3;
      iVar6 = local_104 - t4;
      iVar7 = x - t4;
      *(undefined8 *)((long)&uStack_140 + lVar2) = 0x18639f;
      auVar10._0_4_ = box_integral_unconditional_opt(piVar4,iVar5,iVar6,iVar3,iVar7);
      piVar4 = _width;
      iVar7 = t5;
      iVar6 = t7;
      iVar5 = x;
      iVar3 = local_104;
      auVar10._4_60_ = extraout_var_00;
      auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar10._0_16_,
                               ZEXT416((uint)local_138[1]));
      Dxy = auVar1._0_4_;
      *(undefined8 *)((long)&uStack_140 + lVar2) = 0x1863df;
      local_138[2] = box_integral_unconditional_opt(piVar4,iVar6,iVar3,iVar7,iVar5);
      piVar4 = _width;
      iVar7 = t6;
      iVar6 = t8;
      iVar5 = t9;
      iVar3 = local_100;
      *(undefined8 *)((long)&uStack_140 + lVar2) = 0x186409;
      local_138[3] = box_integral_unconditional_opt(piVar4,iVar3,iVar6,iVar5,iVar7);
      piVar4 = _width;
      iVar7 = t5;
      iVar6 = t6;
      iVar5 = t7;
      iVar3 = t8;
      local_138[3] = local_138[2] + local_138[3];
      *(undefined8 *)((long)&uStack_140 + lVar2) = 0x186443;
      local_128 = box_integral_unconditional_opt(piVar4,iVar5,iVar3,iVar7,iVar6);
      piVar4 = _width;
      iVar7 = t9;
      iVar6 = x;
      iVar5 = local_100;
      iVar3 = local_104;
      local_128 = local_138[3] - local_128;
      *(undefined8 *)((long)&uStack_140 + lVar2) = 0x18647d;
      fVar8 = box_integral_unconditional_opt(piVar4,iVar5,iVar3,iVar7,iVar6);
      Dyy0 = Dyy * Dyy0;
      Dxy = Dyy * Dxy;
      Dyy1 = Dyy * (local_128 - fVar8);
      auVar1 = vfmadd213ss_fma(ZEXT416((uint)Dyy0),ZEXT416((uint)Dxy),
                               ZEXT416((uint)-(Dyy1 * 0.81 * Dyy1)));
      *(int *)(laplacian + (long)k0 * 4) = auVar1._0_4_;
      _k[k0] = 0.0 <= Dxy + Dyy0;
      k0 = k0 + 1;
    }
  }
  return;
}

Assistant:

inline void image_32_filter_75_case(struct response_layer *layer, struct integral_image *iimage) {
    int height = layer->height;
    int width = layer->width;

    int data_width = iimage->data_width;

    int iwidth = iimage->width;
    int iheight = iimage->height;

    float *data = (float *) iimage->data;
    int step = layer->step;
    int filter_size = layer->filter_size;
    int border = (filter_size - 1) / 2;
    int lobe = filter_size / 3;
    float inv_area = 1.f/(filter_size*filter_size);

    float Dxx, Dyy, Dxy, Dyy0, Dyy1, A, B, C, D;
    float A0, A1, B0, B1, C0, C1, D0, D1;
    int r10, r11, c10, c11, r00, r01, c00, c01;
    float* response = layer->response;
    bool* laplacian = layer->laplacian;

    int ind = 0;

    int k, k0, i, j, t0, t1, t2, t3, t4, t5, t6, t7, t8, t9;
    int x = 0;
    int y = 0;

    /* 2.2.b Half the filter is longer than the image, but narrower.
    // HERE: width > lobe and height <= border
    // Here only the whole filter is optimized, not negative part

    // Only happens for filter: 75 and image: 32

    // A, B = 0
    // D is outside (i.e. below) the image, but the columns change.
    // => D = [height-1, some_column]
    // C = 0 or [height-1, some_column]
    */

    // Create array for Dyy that has image width length
    // all rows (for big part) have same Dyy values
    float Dyy_arr[iwidth];  // stack is faster than heap

    // C = 0 and D = [height-1, some_column]
    // from y = 0 until D is (exclusive) in last column
    for (i = 0; i < width*step-lobe; i += step) {  // 0 - 7
        // C = 0
        // D = [height-1, i+lobe-1]
        D = data[(iheight-1) * data_width + (i+lobe-1)];
        Dyy_arr[i] = D;
    }

    // only bottom left corner value needed
    D = data[(iheight-1) * data_width + (iwidth-1)];

    // C = 0 and D = [height-1, width-1] (below or right of bottom corner)
    // C is still outside and D now too
    for (; i < lobe; i += step) {  // 7 - 25
        Dyy_arr[i] = D;
    }

    // if y = lobe, then C = [height-1, 0]
    // C = [height-1, some_column] and D = [height-1, width-1] (below or right of bottom corner)
    for (; i < width*step; i += step) {  // 25 - 32
        // C = [height-1, i-lobe]
        // D = [height-1, width-1]
        C = data[(iheight-1) * data_width + (i-lobe)];
        Dyy_arr[i] = D - C;
    }

    // Use precomputation for faster compute
    for (x = 0; x < height * step; x += step) {

        // precompute
        t0 = x - lobe;
        t1 = x + lobe - 1;
        t2 = lobe/2 + 1;
        t3 = x - 1;
        t5 = x - lobe - 1;
        t7 = x + lobe;
        t9 = x - lobe / 2 - 1;

        for (y = 0; y < width * step; y += step) {
            // box_integral_unconditional precompute
            t4 = y - 1;
            t6 = y - lobe - 1;
            t8 = y + lobe;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dyy = Dyy_arr[y] - 3 * box_integral_unconditional_opt(iimage, t9, t6 + 1, t9 + lobe , t8 - 2);

            // Compute Dxx, Dxy
            Dxx = box_integral_unconditional_opt(iimage, t0, y-border-1, t1, y+border)
                - 3 * box_integral_unconditional_opt(iimage, t0, y-t2, t1, t8-t2);
            Dxy = box_integral_unconditional_opt(iimage, t5, y, t3, t8)
                    + box_integral_unconditional_opt(iimage, x, t6, t7, t4)
                    - box_integral_unconditional_opt(iimage, t5, t6, t3, t4)
                    - box_integral_unconditional_opt(iimage, x, y, t7, t8);

            // Normalize Responses with inverse area
            Dyy *= inv_area;
            Dxx *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = Dxx + Dyy >= 0;

            // Increment index
            ind += 1;
        }
    }
}